

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O1

bool doctest::operator<(Approx *lhs,double rhs)

{
  double dVar1;
  double dVar2;
  
  dVar1 = lhs->m_value;
  if (dVar1 < rhs) {
    dVar2 = ABS(dVar1);
    if (ABS(dVar1) <= ABS(rhs)) {
      dVar2 = ABS(rhs);
    }
    return (dVar2 + lhs->m_scale) * lhs->m_epsilon <= ABS(rhs - dVar1);
  }
  return false;
}

Assistant:

bool operator<(const Approx& lhs, double rhs) { return lhs.m_value < rhs && lhs != rhs; }